

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.cc
# Opt level: O0

void asn1_item_clear(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  
  switch(it->itype) {
  case '\0':
    if (it->templates == (ASN1_TEMPLATE *)0x0) {
      asn1_primitive_clear(pval,it);
    }
    else {
      asn1_template_clear(pval,it->templates);
    }
    break;
  case '\x01':
  case '\x02':
    *pval = (ASN1_VALUE *)0x0;
    break;
  case '\x04':
    *pval = (ASN1_VALUE *)0x0;
    break;
  case '\x05':
    asn1_primitive_clear(pval,it);
  }
  return;
}

Assistant:

static void asn1_item_clear(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  switch (it->itype) {
    case ASN1_ITYPE_EXTERN:
      *pval = NULL;
      break;

    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        asn1_template_clear(pval, it->templates);
      } else {
        asn1_primitive_clear(pval, it);
      }
      break;

    case ASN1_ITYPE_MSTRING:
      asn1_primitive_clear(pval, it);
      break;

    case ASN1_ITYPE_CHOICE:
    case ASN1_ITYPE_SEQUENCE:
      *pval = NULL;
      break;
  }
}